

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O1

EGLenum eglu::parseClientAPI(string *api)

{
  int iVar1;
  EGLenum EVar2;
  InternalError *this;
  long *plVar3;
  size_type *psVar4;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = std::__cxx11::string::compare((char *)api);
  if (iVar1 == 0) {
    EVar2 = 0x30a2;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)api);
    if (iVar1 == 0) {
      EVar2 = 0x30a0;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)api);
      EVar2 = 0x30a1;
      if (iVar1 != 0) {
        this = (InternalError *)__cxa_allocate_exception(0x38);
        std::operator+(&local_40,"Unknown EGL client API \'",api);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
        local_60._M_dataplus._M_p = (pointer)*plVar3;
        psVar4 = (size_type *)(plVar3 + 2);
        if ((size_type *)local_60._M_dataplus._M_p == psVar4) {
          local_60.field_2._M_allocated_capacity = *psVar4;
          local_60.field_2._8_8_ = plVar3[3];
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        }
        else {
          local_60.field_2._M_allocated_capacity = *psVar4;
        }
        local_60._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        tcu::InternalError::InternalError(this,&local_60);
        __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  return EVar2;
}

Assistant:

EGLenum parseClientAPI (const std::string& api)
{
	if (api == "OpenGL")
		return EGL_OPENGL_API;
	else if (api == "OpenGL_ES")
		return EGL_OPENGL_ES_API;
	else if (api == "OpenVG")
		return EGL_OPENVG_API;
	else
		throw tcu::InternalError("Unknown EGL client API '" + api + "'");
}